

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::set_tp(registry *this,shared_ptr<spdlog::details::thread_pool> *tp)

{
  shared_ptr<spdlog::details::thread_pool> *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RSI,in_RDI);
  std::shared_ptr<spdlog::details::thread_pool>::operator=
            (in_RSI,(shared_ptr<spdlog::details::thread_pool> *)in_RDI);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x15b839);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_tp(std::shared_ptr<thread_pool> tp)
{
    std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
    tp_ = std::move(tp);
}